

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
             *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it)

{
  wchar_t wVar1;
  long lVar2;
  ulong uVar3;
  wchar_t *pwVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  wchar_t wVar8;
  char *pcVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  
  lVar2 = *(long *)(this + 0x10);
  if (lVar2 != 0) {
    pwVar4 = (it->super_truncating_iterator_base<wchar_t_*>).out_;
    uVar3 = (it->super_truncating_iterator_base<wchar_t_*>).limit_;
    uVar5 = (it->super_truncating_iterator_base<wchar_t_*>).count_;
    wVar8 = it->blackhole_;
    if (0 < lVar2) {
      pcVar9 = *(char **)(this + 8);
      lVar10 = lVar2 + 1;
      uVar7 = uVar5;
      do {
        if (uVar7 < uVar3) {
          *pwVar4 = (int)*pcVar9;
          lVar12 = 4;
        }
        else {
          lVar12 = 0;
          wVar8 = (int)*pcVar9;
        }
        pcVar9 = pcVar9 + 1;
        uVar7 = uVar7 + 1;
        pwVar4 = (wchar_t *)((long)pwVar4 + lVar12);
        lVar10 = lVar10 + -1;
      } while (1 < lVar10);
      uVar5 = uVar5 + lVar2;
    }
    (it->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar4;
    (it->super_truncating_iterator_base<wchar_t_*>).limit_ = uVar3;
    (it->super_truncating_iterator_base<wchar_t_*>).count_ = uVar5;
    it->blackhole_ = wVar8;
  }
  pwVar4 = (it->super_truncating_iterator_base<wchar_t_*>).out_;
  uVar3 = (it->super_truncating_iterator_base<wchar_t_*>).limit_;
  sVar6 = (it->super_truncating_iterator_base<wchar_t_*>).count_;
  wVar8 = it->blackhole_;
  lVar2 = *(long *)(this + 0x20);
  if (lVar2 != 0) {
    wVar1 = *(wchar_t *)(this + 0x18);
    lVar10 = lVar2;
    sVar11 = sVar6;
    do {
      if (sVar11 < uVar3) {
        *pwVar4 = wVar1;
        lVar12 = 4;
      }
      else {
        lVar12 = 0;
        wVar8 = wVar1;
      }
      sVar11 = sVar11 + 1;
      pwVar4 = (wchar_t *)((long)pwVar4 + lVar12);
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
    sVar6 = sVar6 + lVar2;
  }
  (it->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar4;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ = uVar3;
  (it->super_truncating_iterator_base<wchar_t_*>).count_ = sVar6;
  it->blackhole_ = wVar8;
  int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::hex_writer::operator()
            ((hex_writer *)(this + 0x28),it);
  return;
}

Assistant:

inline T *make_checked(T *p, std::size_t) { return p; }